

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QScriptItem>::emplace<QScriptItem_const&>
          (QPodArrayOps<QScriptItem> *this,qsizetype i,QScriptItem *args)

{
  QScriptItem **ppQVar1;
  qsizetype *pqVar2;
  int iVar3;
  Data *pDVar4;
  undefined8 uVar5;
  QScriptItem *pQVar6;
  int iVar7;
  QScriptAnalysis QVar8;
  unsigned_short uVar9;
  undefined2 uVar10;
  QFixed QVar11;
  QFixed QVar12;
  QFixed QVar13;
  QFixed QVar14;
  QScriptItem *pQVar15;
  GrowthPosition where;
  
  pDVar4 = (this->super_QArrayDataPointer<QScriptItem>).d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00505384:
    uVar9 = args->num_glyphs;
    uVar10 = *(undefined2 *)&args->field_0xa;
    iVar3 = args->glyph_data_offset;
    QVar11.val = (args->descent).val;
    QVar12.val = (args->ascent).val;
    QVar13.val = (args->leading).val;
    QVar14.val = (args->width).val;
    iVar7 = args->position;
    QVar8 = args->analysis;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QScriptItem>).size != 0);
    QArrayDataPointer<QScriptItem>::detachAndGrow
              (&this->super_QArrayDataPointer<QScriptItem>,where,1,(QScriptItem **)0x0,
               (QArrayDataPointer<QScriptItem> *)0x0);
    pQVar15 = createHole(this,where,i,1);
    pQVar15->position = iVar7;
    pQVar15->analysis = QVar8;
    pQVar15->num_glyphs = uVar9;
    *(undefined2 *)&pQVar15->field_0xa = uVar10;
    pQVar15->descent = (QFixed)QVar11.val;
    pQVar15->ascent = (QFixed)QVar12.val;
    pQVar15->leading = (QFixed)QVar13.val;
    pQVar15->width = (QFixed)QVar14.val;
    pQVar15->glyph_data_offset = iVar3;
  }
  else {
    if (((this->super_QArrayDataPointer<QScriptItem>).size == i) &&
       (pQVar15 = (this->super_QArrayDataPointer<QScriptItem>).ptr,
       (pDVar4->super_QArrayData).alloc !=
       ((long)((long)pQVar15 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
       i)) {
      iVar3 = args->position;
      QVar8 = args->analysis;
      uVar9 = args->num_glyphs;
      uVar10 = *(undefined2 *)&args->field_0xa;
      QVar12.val = (args->descent).val;
      QVar11.val = (args->leading).val;
      uVar5 = *(undefined8 *)&args->width;
      pQVar6 = pQVar15 + i;
      pQVar6->ascent = (QFixed)(args->ascent).val;
      pQVar6->leading = (QFixed)QVar11.val;
      *(undefined8 *)(&pQVar6->ascent + 2) = uVar5;
      pQVar15 = pQVar15 + i;
      pQVar15->position = iVar3;
      pQVar15->analysis = QVar8;
      pQVar15->num_glyphs = uVar9;
      *(undefined2 *)&pQVar15->field_0xa = uVar10;
      pQVar15->descent = (QFixed)QVar12.val;
    }
    else {
      if ((i != 0) ||
         (pQVar15 = (this->super_QArrayDataPointer<QScriptItem>).ptr,
         (QScriptItem *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pQVar15)) goto LAB_00505384;
      iVar7 = args->position;
      QVar8 = args->analysis;
      uVar9 = args->num_glyphs;
      uVar10 = *(undefined2 *)&args->field_0xa;
      QVar13.val = (args->descent).val;
      QVar11.val = (args->leading).val;
      QVar12.val = (args->width).val;
      iVar3 = args->glyph_data_offset;
      pQVar15[-1].ascent = (QFixed)(args->ascent).val;
      pQVar15[-1].leading = (QFixed)QVar11.val;
      pQVar15[-1].width = (QFixed)QVar12.val;
      pQVar15[-1].glyph_data_offset = iVar3;
      pQVar15[-1].position = iVar7;
      pQVar15[-1].analysis = QVar8;
      pQVar15[-1].num_glyphs = uVar9;
      *(undefined2 *)&pQVar15[-1].field_0xa = uVar10;
      pQVar15[-1].descent = (QFixed)QVar13.val;
      ppQVar1 = &(this->super_QArrayDataPointer<QScriptItem>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QScriptItem>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }